

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.c
# Opt level: O3

void readImageData(FILE *flagData,png_structpp png_ptr,png_infopp info_ptr)

{
  int iVar1;
  png_struct *ppVar2;
  png_info *ppVar3;
  __jmp_buf_tag *__env;
  
  if (info_ptr != (png_infopp)0x0 && (png_ptr != (png_structpp)0x0 && flagData != (FILE *)0x0)) {
    ppVar2 = (png_struct *)png_create_read_struct("1.6.37",0,0);
    *png_ptr = ppVar2;
    if (ppVar2 != (png_struct *)0x0) {
      ppVar3 = (png_info *)png_create_info_struct(ppVar2);
      *info_ptr = ppVar3;
      if (ppVar3 == (png_info *)0x0) {
        png_destroy_read_struct(png_ptr,0);
      }
      else {
        __env = (__jmp_buf_tag *)png_set_longjmp_fn(*png_ptr,longjmp,200);
        iVar1 = _setjmp(__env);
        if (iVar1 == 0) {
          png_init_io(*png_ptr,flagData);
          png_set_sig_bytes(*png_ptr,8);
          png_read_png(*png_ptr,*info_ptr,0x2004,0);
          fclose((FILE *)flagData);
        }
        else {
          png_destroy_read_struct(png_ptr,info_ptr,0);
          puts("The has been an issue when reading the file. If only I knew...");
        }
      }
    }
  }
  return;
}

Assistant:

void readImageData (FILE *flagData, png_structpp png_ptr, png_infopp info_ptr)
{
	if (flagData == NULL || png_ptr == NULL || info_ptr == NULL)
		return;
	/* Initialization */
	*png_ptr = png_create_read_struct(PNG_LIBPNG_VER_STRING,NULL,NULL,NULL);
	if (*png_ptr == NULL)
		return;
	*info_ptr = png_create_info_struct(*png_ptr);
	if (*info_ptr == NULL)
	{
		png_destroy_read_struct(png_ptr, NULL, NULL);
		return;
	}
	if (setjmp(png_jmpbuf(*png_ptr)))
	{
		/* Free all of the memory associated with the png_ptr and info_ptr */
		png_destroy_read_struct(png_ptr, info_ptr, NULL);
		/* If we get here, we had a problem reading the file. */
		printf("The has been an issue when reading the file. If only I knew...\n");
		return;
	}
	png_init_io(*png_ptr, flagData);

	/* Start reading data from the file (except for the signature, which has been read before) */
	png_set_sig_bytes(*png_ptr, 8);
	png_read_png(*png_ptr, *info_ptr, PNG_TRANSFORM_PACKING | PNG_TRANSFORM_GRAY_TO_RGB, NULL);
	fclose(flagData);
	return;
}